

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O2

void cht_Give(player_t *player,char *name,int amount)

{
  uint uVar1;
  APlayerPawn *this;
  AWeapon *pAVar2;
  PClassWeapon *type;
  BYTE *pBVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  PClassActor *pPVar8;
  AActor *pAVar9;
  AHexenArmor *this_00;
  ABasicArmorPickup *this_01;
  AInventory *pAVar10;
  PClassWeapon *pPVar11;
  PClassActor *pPVar12;
  uint i;
  ulong uVar13;
  uint i_3;
  bool bVar14;
  
  if ((player_t *)(&players + (long)consoleplayer * 0x54) != player) {
    pcVar7 = userinfo_t::GetName(&player->userinfo);
    Printf("%s is a cheater: give %s\n",pcVar7,name);
  }
  this = player->mo;
  if (this == (APlayerPawn *)0x0) {
    return;
  }
  if (player->health < 1) {
    return;
  }
  iVar6 = strcasecmp(name,"all");
  if (iVar6 == 0) {
    bVar4 = false;
    bVar14 = false;
  }
  else {
    iVar6 = strcasecmp(name,"everything");
    bVar14 = iVar6 == 0;
    bVar4 = !bVar14;
  }
  iVar6 = strcasecmp(name,"health");
  if (iVar6 == 0) {
    if (amount < 1) {
      iVar6 = APlayerPawn::GetMaxHealth(this);
      (player->mo->super_AActor).health = iVar6;
    }
    else {
      iVar6 = (this->super_AActor).health + amount;
      (this->super_AActor).health = iVar6;
    }
    player->health = iVar6;
  }
  if ((bVar4) && (iVar6 = strcasecmp(name,"backpack"), iVar6 != 0)) {
    iVar6 = strcasecmp(name,"ammo");
    if (iVar6 == 0) goto LAB_0046af29;
    iVar6 = strcasecmp(name,"armor");
    if (iVar6 == 0) goto LAB_0046afbb;
    iVar6 = strcasecmp(name,"keys");
    if (iVar6 == 0) goto LAB_0046b074;
    iVar6 = strcasecmp(name,"weapons");
    if (iVar6 == 0) goto LAB_0046b0ee;
    iVar6 = strcasecmp(name,"artifacts");
    if (iVar6 != 0) {
      iVar6 = strcasecmp(name,"puzzlepieces");
      if (iVar6 != 0) {
        pPVar8 = PClass::FindActor(name);
        if ((pPVar8 != (PClassActor *)0x0) &&
           (bVar4 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,&pPVar8->super_PClass)
           , bVar4)) {
          (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])
                    (player->mo,pPVar8,(ulong)(uint)amount,1);
          return;
        }
        if ((player_t *)(&players + (long)consoleplayer * 0x54) != player) {
          return;
        }
        Printf("Unknown item \"%s\"\n",name);
        return;
      }
      goto LAB_0046b2ca;
    }
  }
  else {
    pPVar8 = PClass::FindActor(&gameinfo.backpacktype);
    if (pPVar8 != (PClassActor *)0x0) {
      (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])
                (player->mo,pPVar8,1);
    }
    if (bVar4) {
      return;
    }
LAB_0046af29:
    for (uVar13 = 0; uVar13 < PClassActor::AllActorClasses.Count; uVar13 = uVar13 + 1) {
      pPVar8 = PClassActor::AllActorClasses.Array[uVar13];
      if ((pPVar8->super_PClass).ParentClass == AAmmo::RegistrationInfo.MyClass) {
        pAVar10 = AActor::FindInventory(&player->mo->super_AActor,pPVar8,false);
        if (pAVar10 == (AInventory *)0x0) {
          pAVar9 = Spawn(pPVar8);
          (*(pAVar9->super_DThinker).super_DObject._vptr_DObject[0x31])(pAVar9,player->mo);
          *(undefined4 *)&pAVar9[1].super_DThinker.super_DObject.Class =
               *(undefined4 *)((long)&pAVar9[1].super_DThinker.super_DObject.Class + 4);
        }
        else if (pAVar10->Amount < pAVar10->MaxAmount) {
          pAVar10->Amount = pAVar10->MaxAmount;
        }
      }
    }
    if (bVar4) {
      return;
    }
LAB_0046afbb:
    if (gameinfo.gametype == GAME_Hexen) {
      for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
        this_00 = Spawn<AHexenArmor>();
        (this_00->super_AArmor).super_AInventory.super_AActor.health = iVar6;
        (this_00->super_AArmor).super_AInventory.Amount = 0;
        bVar5 = AInventory::CallTryPickup
                          ((AInventory *)this_00,&player->mo->super_AActor,(AActor **)0x0);
        if (!bVar5) {
          (*(this_00->super_AArmor).super_AInventory.super_AActor.super_DThinker.super_DObject.
            _vptr_DObject[4])(this_00);
        }
      }
    }
    else {
      this_01 = Spawn<ABasicArmorPickup>();
      this_01->SaveAmount = deh.BlueAC * 100;
      this_01->SavePercent =
           (double)(~-(ulong)(0.0 < gameinfo.Armor2Percent) & 0x3fe0000000000000 |
                   (ulong)gameinfo.Armor2Percent & -(ulong)(0.0 < gameinfo.Armor2Percent));
      bVar5 = AInventory::CallTryPickup
                        ((AInventory *)this_01,&player->mo->super_AActor,(AActor **)0x0);
      if (!bVar5) {
        (*(this_01->super_AArmor).super_AInventory.super_AActor.super_DThinker.super_DObject.
          _vptr_DObject[4])(this_01);
      }
    }
    if (bVar4) {
      return;
    }
LAB_0046b074:
    for (uVar13 = 0; uVar13 < PClassActor::AllActorClasses.Count; uVar13 = uVar13 + 1) {
      bVar5 = PClass::IsAncestorOf
                        (AKey::RegistrationInfo.MyClass,
                         &PClassActor::AllActorClasses.Array[uVar13]->super_PClass);
      if ((bVar5) &&
         ((PClassActor::AllActorClasses.Array[uVar13]->super_PClass).Defaults[0x4dc] != '\0')) {
        pAVar10 = (AInventory *)Spawn(PClassActor::AllActorClasses.Array[uVar13]);
        bVar5 = AInventory::CallTryPickup(pAVar10,&player->mo->super_AActor,(AActor **)0x0);
        if (!bVar5) {
          (*(pAVar10->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar10);
        }
      }
    }
    if (bVar4) {
      return;
    }
LAB_0046b0ee:
    pAVar2 = player->PendingWeapon;
    for (uVar13 = 0; uVar13 < PClassActor::AllActorClasses.Count; uVar13 = uVar13 + 1) {
      type = (PClassWeapon *)PClassActor::AllActorClasses.Array[uVar13];
      if ((type != (PClassWeapon *)AWeapon::RegistrationInfo.MyClass) &&
         (bVar5 = PClass::IsAncestorOf(AWeapon::RegistrationInfo.MyClass,(PClass *)type), bVar5)) {
        pPVar11 = (PClassWeapon *)PClassActor::GetReplacement((PClassActor *)type,true);
        if (pPVar11 != type) {
          pPVar8 = PClassActor::GetReplacement((PClassActor *)type,true);
          bVar5 = PClass::IsAncestorOf
                            (ADehackedPickup::RegistrationInfo.MyClass,&pPVar8->super_PClass);
          if (!bVar5) goto LAB_0046b1b5;
        }
        bVar5 = FWeaponSlots::LocateWeapon(&player->weapons,type,(int *)0x0,(int *)0x0);
        if ((bVar5) &&
           ((bVar14 ||
            (((type->super_PClassInventory).super_PClassActor.super_PClass.Defaults[0x4df] & 8) == 0
            )))) {
          (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])
                    (player->mo,type,1);
        }
      }
LAB_0046b1b5:
    }
    player->PendingWeapon = pAVar2;
    if (bVar4) {
      return;
    }
  }
  for (uVar13 = 0; uVar13 < PClassActor::AllActorClasses.Count; uVar13 = uVar13 + 1) {
    pPVar8 = PClassActor::AllActorClasses.Array[uVar13];
    bVar5 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,&pPVar8->super_PClass);
    if (((((bVar5) && (pBVar3 = (pPVar8->super_PClass).Defaults, 0 < *(int *)(pBVar3 + 0x4b8))) &&
         (1 < *(int *)(pBVar3 + 0x4ac))) &&
        ((bVar5 = PClass::IsAncestorOf(APuzzleItem::RegistrationInfo.MyClass,&pPVar8->super_PClass),
         !bVar5 && (bVar5 = PClass::IsAncestorOf
                                      (APowerup::RegistrationInfo.MyClass,&pPVar8->super_PClass),
                   !bVar5)))) &&
       ((bVar5 = PClass::IsAncestorOf(AArmor::RegistrationInfo.MyClass,&pPVar8->super_PClass),
        !bVar5 && ((bVar14 ||
                   (pPVar12 = PClassActor::GetReplacement(pPVar8,true), pPVar12 == pPVar8)))))) {
      uVar1 = amount;
      if (amount < 1) {
        uVar1 = *(uint *)(pBVar3 + 0x4ac);
      }
      (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])
                (player->mo,pPVar8,(ulong)uVar1,1);
    }
  }
  if (bVar4) {
    return;
  }
LAB_0046b2ca:
  for (uVar13 = 0; uVar13 < PClassActor::AllActorClasses.Count; uVar13 = uVar13 + 1) {
    pPVar8 = PClassActor::AllActorClasses.Array[uVar13];
    bVar4 = PClass::IsAncestorOf(APuzzleItem::RegistrationInfo.MyClass,&pPVar8->super_PClass);
    if (((bVar4) && (pBVar3 = (pPVar8->super_PClass).Defaults, 0 < *(int *)(pBVar3 + 0x4b8))) &&
       ((bVar14 || (pPVar12 = PClassActor::GetReplacement(pPVar8,true), pPVar12 == pPVar8)))) {
      uVar1 = amount;
      if (amount < 1) {
        uVar1 = *(uint *)(pBVar3 + 0x4ac);
      }
      (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])
                (player->mo,pPVar8,(ulong)uVar1,1);
    }
  }
  return;
}

Assistant:

void cht_Give (player_t *player, const char *name, int amount)
{
	enum { ALL_NO, ALL_YES, ALL_YESYES } giveall;
	int i;
	PClassActor *type;

	if (player != &players[consoleplayer])
		Printf ("%s is a cheater: give %s\n", player->userinfo.GetName(), name);

	if (player->mo == NULL || player->health <= 0)
	{
		return;
	}

	giveall = ALL_NO;
	if (stricmp (name, "all") == 0)
	{
		giveall = ALL_YES;
	}
	else if (stricmp (name, "everything") == 0)
	{
		giveall = ALL_YESYES;
	}

	if (stricmp (name, "health") == 0)
	{
		if (amount > 0)
		{
			player->mo->health += amount;
			player->health = player->mo->health;
		}
		else
		{
			player->health = player->mo->health = player->mo->GetMaxHealth();
		}
	}

	if (giveall || stricmp (name, "backpack") == 0)
	{
		// Select the correct type of backpack based on the game
		type = PClass::FindActor(gameinfo.backpacktype);
		if (type != NULL)
		{
			player->mo->GiveInventory(static_cast<PClassInventory *>(type), 1, true);
		}

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "ammo") == 0)
	{
		// Find every unique type of ammo. Give it to the player if
		// he doesn't have it already, and set each to its maximum.
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			PClassActor *type = PClassActor::AllActorClasses[i];

			if (type->ParentClass == RUNTIME_CLASS(AAmmo))
			{
				PClassAmmo *atype = static_cast<PClassAmmo *>(type);
				AInventory *ammo = player->mo->FindInventory(atype);
				if (ammo == NULL)
				{
					ammo = static_cast<AInventory *>(Spawn (atype));
					ammo->AttachToOwner (player->mo);
					ammo->Amount = ammo->MaxAmount;
				}
				else if (ammo->Amount < ammo->MaxAmount)
				{
					ammo->Amount = ammo->MaxAmount;
				}
			}
		}

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "armor") == 0)
	{
		if (gameinfo.gametype != GAME_Hexen)
		{
			ABasicArmorPickup *armor = Spawn<ABasicArmorPickup> ();
			armor->SaveAmount = 100*deh.BlueAC;
			armor->SavePercent = gameinfo.Armor2Percent > 0? gameinfo.Armor2Percent : 0.5;
			if (!armor->CallTryPickup (player->mo))
			{
				armor->Destroy ();
			}
		}
		else
		{
			for (i = 0; i < 4; ++i)
			{
				AHexenArmor *armor = Spawn<AHexenArmor> ();
				armor->health = i;
				armor->Amount = 0;
				if (!armor->CallTryPickup (player->mo))
				{
					armor->Destroy ();
				}
			}
		}

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "keys") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			if (PClassActor::AllActorClasses[i]->IsDescendantOf (RUNTIME_CLASS(AKey)))
			{
				AKey *key = (AKey *)GetDefaultByType (PClassActor::AllActorClasses[i]);
				if (key->KeyNumber != 0)
				{
					key = static_cast<AKey *>(Spawn(static_cast<PClassActor *>(PClassActor::AllActorClasses[i])));
					if (!key->CallTryPickup (player->mo))
					{
						key->Destroy ();
					}
				}
			}
		}
		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "weapons") == 0)
	{
		AWeapon *savedpending = player->PendingWeapon;
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];
			// Don't give replaced weapons unless the replacement was done by Dehacked.
			if (type != RUNTIME_CLASS(AWeapon) &&
				type->IsDescendantOf (RUNTIME_CLASS(AWeapon)) &&
				(static_cast<PClassActor *>(type)->GetReplacement() == type ||
				 static_cast<PClassActor *>(type)->GetReplacement()->IsDescendantOf(RUNTIME_CLASS(ADehackedPickup))))
			{
				// Give the weapon only if it belongs to the current game or
				if (player->weapons.LocateWeapon(static_cast<PClassWeapon*>(type), NULL, NULL))
				{
					AWeapon *def = (AWeapon*)GetDefaultByType (type);
					if (giveall == ALL_YESYES || !(def->WeaponFlags & WIF_CHEATNOTWEAPON))
					{
						player->mo->GiveInventory(static_cast<PClassInventory *>(type), 1, true);
					}
				}
			}
		}
		player->PendingWeapon = savedpending;

		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "artifacts") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];
			if (type->IsDescendantOf (RUNTIME_CLASS(AInventory)))
			{
				AInventory *def = (AInventory*)GetDefaultByType (type);
				if (def->Icon.isValid() && def->MaxAmount > 1 &&
					!type->IsDescendantOf (RUNTIME_CLASS(APuzzleItem)) &&
					!type->IsDescendantOf (RUNTIME_CLASS(APowerup)) &&
					!type->IsDescendantOf (RUNTIME_CLASS(AArmor)))
				{
					// Do not give replaced items unless using "give everything"
					if (giveall == ALL_YESYES || type->GetReplacement() == type)
					{
						player->mo->GiveInventory(static_cast<PClassInventory *>(type), amount <= 0 ? def->MaxAmount : amount, true);
					}
				}
			}
		}
		if (!giveall)
			return;
	}

	if (giveall || stricmp (name, "puzzlepieces") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];
			if (type->IsDescendantOf (RUNTIME_CLASS(APuzzleItem)))
			{
				AInventory *def = (AInventory*)GetDefaultByType (type);
				if (def->Icon.isValid())
				{
					// Do not give replaced items unless using "give everything"
					if (giveall == ALL_YESYES || type->GetReplacement() == type)
					{
						player->mo->GiveInventory(static_cast<PClassInventory *>(type), amount <= 0 ? def->MaxAmount : amount, true);
					}
				}
			}
		}
		if (!giveall)
			return;
	}

	if (giveall)
		return;

	type = PClass::FindActor(name);
	if (type == NULL || !type->IsDescendantOf (RUNTIME_CLASS(AInventory)))
	{
		if (player == &players[consoleplayer])
			Printf ("Unknown item \"%s\"\n", name);
	}
	else
	{
		player->mo->GiveInventory(static_cast<PClassInventory *>(type), amount, true);
	}
	return;
}